

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::readArrayBasedContainer<QList<TCBPoint>>(QDataStream *s,QList<TCBPoint> *c)

{
  Status SVar1;
  qreal asize;
  long in_FS_OFFSET;
  quint32 first;
  TCBPoint local_78;
  uint local_4c;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QList<TCBPoint>::clear(c);
  local_4c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(qint32 *)&local_4c);
  asize = (qreal)(ulong)local_4c;
  if (asize == 2.12199578997714e-314) {
    if (0x15 < s->ver) {
      local_78._point.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(qint64 *)&local_78);
      asize = local_78._point.xp;
      if ((long)local_78._point.xp < 0) goto LAB_003e77b3;
    }
  }
  else if (local_4c == 0xffffffff) {
LAB_003e77b3:
    QDataStream::setStatus(s,SizeLimitExceeded);
    goto LAB_003e785c;
  }
  QList<TCBPoint>::reserve(c,(qsizetype)asize);
  for (; asize != 0.0; asize = (qreal)((long)asize - 1)) {
    local_78._t._0_4_ = 0xffffffff;
    local_78._t._4_4_ = 0xffffffff;
    local_78._c._0_4_ = 0xffffffff;
    local_78._c._4_4_ = 0xffffffff;
    local_78._b = -NAN;
    local_78._point.xp = 0.0;
    local_78._point.yp = 0.0;
    ::operator>>(s,&local_78);
    SVar1 = QDataStream::status(s);
    if (SVar1 != Ok) {
      QList<TCBPoint>::clear(c);
      break;
    }
    QPodArrayOps<TCBPoint>::emplace<TCBPoint_const&>
              ((QPodArrayOps<TCBPoint> *)c,(c->d).size,&local_78);
    QList<TCBPoint>::end(c);
  }
LAB_003e785c:
  if (local_48._8_4_ != Ok) {
    QDataStream::resetStatus((QDataStream *)local_48._0_8_);
    QDataStream::setStatus((QDataStream *)local_48._0_8_,local_48._8_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}